

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t copy_string(archive_read *a,wchar_t len,wchar_t dist)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3._0_4_ = (a->archive).current_codepage;
  lVar3._4_4_ = (a->archive).current_oemcp;
  if (lVar3 != 0) {
    lVar3 = (a->archive).read_data_output_offset;
    if (L'\0' < len) {
      uVar1 = (a->archive).read_data_offset;
      uVar4 = (ulong)(uint)len;
      uVar2 = lVar3 + (a->archive).read_data_requested;
      do {
        lVar3 = *(long *)&(a->archive).current_codepage;
        *(undefined1 *)(lVar3 + (uVar2 & uVar1)) =
             *(undefined1 *)(lVar3 + (uVar2 - (long)dist & uVar1));
        uVar2 = uVar2 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      lVar3 = (a->archive).read_data_output_offset;
    }
    (a->archive).read_data_output_offset = len + lVar3;
    return L'\0';
  }
  return L'\xffffffe2';
}

Assistant:

static int copy_string(struct archive_read* a, int len, int dist) {
	struct rar5* rar = get_context(a);
	const uint64_t cmask = rar->cstate.window_mask;
	const uint64_t write_ptr = rar->cstate.write_ptr +
	    rar->cstate.solid_offset;
	int i;

	if (rar->cstate.window_buf == NULL)
		return ARCHIVE_FATAL;

	/* The unpacker spends most of the time in this function. It would be
	 * a good idea to introduce some optimizations here.
	 *
	 * Just remember that this loop treats buffers that overlap differently
	 * than buffers that do not overlap. This is why a simple memcpy(3)
	 * call will not be enough. */

	for(i = 0; i < len; i++) {
		const ssize_t write_idx = (write_ptr + i) & cmask;
		const ssize_t read_idx = (write_ptr + i - dist) & cmask;
		rar->cstate.window_buf[write_idx] =
		    rar->cstate.window_buf[read_idx];
	}

	rar->cstate.write_ptr += len;
	return ARCHIVE_OK;
}